

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergeFrom
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *from)

{
  uint uVar1;
  ExtensionRangeOptions *in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  DescriptorProto_ExtensionRange *in_stack_ffffffffffffff10;
  DescriptorProto_ExtensionRange *this_00;
  ExtensionRangeOptions *in_stack_ffffffffffffff88;
  
  this_00 = (DescriptorProto_ExtensionRange *)&in_RSI->_extensions_;
  if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
    if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff10 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff10 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  uVar1 = ((HasBits<1UL> *)&(in_RSI->_extensions_).flat_capacity_)->has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff10);
      _internal_options((DescriptorProto_ExtensionRange *)in_RSI);
      ExtensionRangeOptions::MergeFrom(in_RSI,in_stack_ffffffffffffff88);
    }
    if ((uVar1 & 2) != 0) {
      *(int32 *)(in_RDI + 0x20) =
           *(int32 *)&(in_RSI->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    }
    if ((uVar1 & 4) != 0) {
      *(int32 *)(in_RDI + 0x24) =
           *(int32 *)((long)&(in_RSI->_internal_metadata_).
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_ + 4);
    }
    *(uint *)(in_RDI + 0x10) = uVar1 | *(uint *)(in_RDI + 0x10);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::MergeFrom(const DescriptorProto_ExtensionRange& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto.ExtensionRange)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000002u) {
      start_ = from.start_;
    }
    if (cached_has_bits & 0x00000004u) {
      end_ = from.end_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}